

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

int32_t __thiscall cppnet::Bitmap::GetMinAfter(Bitmap *this,uint32_t index)

{
  byte bVar1;
  uint uVar2;
  pointer plVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  
  plVar3 = (this->_bitmap).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->_bitmap).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)plVar3) * 8) <= (ulong)index) {
    return -1;
  }
  if (this->_vec_bitmap != 0) {
    uVar6 = index >> 6;
    if (plVar3[uVar6] == 0) {
      uVar7 = (index & 0xffffffc0) + 0x40;
    }
    else {
      uVar5 = plVar3[uVar6] >> ((byte)index & 0x3f);
      if (uVar5 == 0) {
        uVar7 = (index & 0xffffffc0) + 0x40;
      }
      else {
        fVar8 = log2f((float)(long)(-uVar5 & uVar5));
        uVar7 = (int)(long)fVar8 + index;
        plVar3 = (pointer)(ulong)uVar7;
      }
      if (uVar5 != 0) {
        return (int32_t)plVar3;
      }
    }
    bVar1 = (byte)uVar6 & 0x1f;
    uVar2 = this->_vec_bitmap >> bVar1;
    if (this->_vec_bitmap >> bVar1 != 0) {
      fVar8 = log2f((float)(int)((-uVar2 & uVar2) + 1));
      iVar4 = (int)(long)fVar8;
      if (iVar4 != 0) {
        plVar3 = (this->_bitmap).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->_bitmap).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)plVar3 >> 3) <=
            (ulong)(uVar6 + iVar4)) {
          return -1;
        }
        uVar5 = plVar3[uVar6 + iVar4];
        fVar8 = log2f((float)(long)((-uVar5 & uVar5) + 1));
        return (int)(long)fVar8 + uVar7 + iVar4 * 0x40 + -0x40;
      }
    }
  }
  return -1;
}

Assistant:

int32_t Bitmap::GetMinAfter(uint32_t index) {
    // get next bit.
    if (index >= _bitmap.size() * __step_size || Empty()) {
        return -1;
    }

    // get index in vector
    uint32_t bitmap_index = index / __step_size;
    // filter smaller bitmap index
    uint32_t ret = bitmap_index * __step_size;

    // find current uint64_t have next 1?
    if (_bitmap[bitmap_index] != 0) {
        int64_t cur_bitmap = _bitmap[bitmap_index];
        int32_t cur_step = index - ret;
        cur_bitmap = cur_bitmap >> cur_step;

        // don't have next 1
        if (cur_bitmap == 0) {
            ret += __step_size;

        // find next 1
        } else {
            ret += cur_step;
            ret += (uint32_t)std::log2f(float(cur_bitmap & (-cur_bitmap)));
            return ret;
        }

    } else {
        ret += __step_size;
    }

    // find next used vector index 
    int32_t temp_vec_bitmap = _vec_bitmap >> bitmap_index;
    if (temp_vec_bitmap == 0) {
        return -1;
    }

    uint32_t next_vec_index = (uint32_t)std::log2f(float((temp_vec_bitmap & (-temp_vec_bitmap)) + 1));
    uint32_t target_vec_index = next_vec_index + bitmap_index;
    if (target_vec_index == bitmap_index) {
        return -1;
    }
    
    if (target_vec_index >= _bitmap.size()) {
        return -1;
    }
    
    int64_t cur_bitmap = _bitmap[target_vec_index];
    ret += (next_vec_index - 1) * __step_size;
    ret += (uint32_t)std::log2f(float((cur_bitmap & (-cur_bitmap)) + 1));

    return ret;
}